

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void addition_suite::add_integer_with_string(void)

{
  error *ex_3;
  basic_variable<std::allocator<char>_> local_2b8;
  undefined1 local_288 [8];
  variable data_3;
  error *ex_2;
  basic_variable<std::allocator<char>_> local_1f8;
  undefined1 local_1c8 [8];
  variable data_2;
  error *ex_1;
  basic_variable<std::allocator<char>_> local_138;
  undefined1 local_108 [8];
  variable data_1;
  error *ex;
  basic_variable<std::allocator<char>_> local_98;
  basic_variable<std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_38,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_98,"alpha");
  trial::dynamic::operator+(&local_68,(basic_variable<std::allocator<char>_> *)local_38,&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::protocol::core::detail::throw_failed_impl
            ("data + variable(\"alpha\")","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9a1,"void addition_suite::add_integer_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_108,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_1,L"bravo");
  trial::dynamic::operator+
            (&local_138,(basic_variable<std::allocator<char>_> *)local_108,
             (basic_variable<std::allocator<char>_> *)&ex_1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_1);
  trial::protocol::core::detail::throw_failed_impl
            ("data + variable(L\"bravo\")","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9a8,"void addition_suite::add_integer_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_1c8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_2,L"charlie");
  trial::dynamic::operator+
            (&local_1f8,(basic_variable<std::allocator<char>_> *)local_1c8,
             (basic_variable<std::allocator<char>_> *)&ex_2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_2);
  trial::protocol::core::detail::throw_failed_impl
            ("data + variable(u\"charlie\")","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9af,"void addition_suite::add_integer_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_288,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_3,L"delta");
  trial::dynamic::operator+
            (&local_2b8,(basic_variable<std::allocator<char>_> *)local_288,
             (basic_variable<std::allocator<char>_> *)&ex_3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_3);
  trial::protocol::core::detail::throw_failed_impl
            ("data + variable(U\"delta\")","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9b6,"void addition_suite::add_integer_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_288);
  return;
}

Assistant:

void add_integer_with_string()
{
    // integer - string
    {
        variable data(2);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data + variable("alpha"),
                                        error,
                                        "incompatible type");
    }
    // integer - wstring
    {
        variable data(2);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data + variable(L"bravo"),
                                        error,
                                        "incompatible type");
    }
    // integer - u16string
    {
        variable data(2);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data + variable(u"charlie"),
                                        error,
                                        "incompatible type");
    }
    // integer - u32string
    {
        variable data(2);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data + variable(U"delta"),
                                        error,
                                        "incompatible type");
    }
}